

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotUTF8(UnicodeSetStringSpan *this,uint8_t *s,int32_t length)

{
  uint uVar1;
  int iVar2;
  uint8_t *puVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint8_t *puVar6;
  long lVar7;
  int length_00;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  
  uVar1 = this->strings->count;
  iVar11 = 0;
  lVar7 = 0;
  if (this->all != '\0') {
    lVar7 = (long)(int)uVar1 * 2;
  }
  puVar3 = this->spanLengths;
  iVar5 = length;
  do {
    iVar4 = UnicodeSet::spanUTF8
                      (this->pSpanNotSet,(char *)(s + iVar11),iVar5,USET_SPAN_NOT_CONTAINED);
    length_00 = iVar5 - iVar4;
    if (length_00 == 0) {
      return length;
    }
    iVar11 = iVar4 + iVar11;
    iVar5 = spanOneUTF8(&this->spanSet,s + iVar11,length_00);
    if (0 < iVar5) {
      return iVar11;
    }
    if (0 < (int)uVar1) {
      puVar6 = this->utf8;
      uVar8 = 0;
      do {
        iVar2 = this->utf8Lengths[uVar8];
        if ((((long)iVar2 != 0) && (iVar2 <= length_00)) && (puVar3[uVar8 + lVar7] != 0xff)) {
          iVar9 = iVar2 + 1;
          lVar10 = 0;
          while ((s + iVar11)[lVar10] == puVar6[lVar10]) {
            lVar10 = lVar10 + 1;
            iVar9 = iVar9 + -1;
            if (iVar9 < 2) {
              return iVar11;
            }
          }
        }
        puVar6 = puVar6 + iVar2;
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar1);
    }
    iVar11 = iVar11 - iVar5;
    iVar5 = length_00 + iVar5;
  } while (iVar5 != 0);
  return length;
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotUTF8(const uint8_t *s, int32_t length) const {
    int32_t pos=0, rest=length;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanUTF8Lengths=spanLengths;
    if(all) {
        spanUTF8Lengths+=2*stringsLength;
    }
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        i=pSpanNotSet->spanUTF8((const char *)s+pos, rest, USET_SPAN_NOT_CONTAINED);
        if(i==rest) {
            return length;  // Reached the end of the string.
        }
        pos+=i;
        rest-=i;

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneUTF8(spanSet, s+pos, rest);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        const uint8_t *s8=utf8;
        int32_t length8;
        for(i=0; i<stringsLength; ++i) {
            length8=utf8Lengths[i];
            // ALL_CP_CONTAINED: Irrelevant string.
            if(length8!=0 && spanUTF8Lengths[i]!=ALL_CP_CONTAINED && length8<=rest && matches8(s+pos, s8, length8)) {
                return pos;  // There is a set element at pos.
            }
            s8+=length8;
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos-=cpLength;
        rest+=cpLength;
    } while(rest!=0);
    return length;  // Reached the end of the string.
}